

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZDICT_analyzeEntropy
                 (void *dstBuffer,size_t maxDstSize,int compressionLevel,void *srcBuffer,
                 size_t *fileSizes,uint nbFiles,void *dictBuffer,size_t dictBufferSize,
                 uint notificationLevel)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint *puVar4;
  uint *code;
  uint *code_00;
  long in_RCX;
  int in_EDX;
  ulong in_RSI;
  size_t *in_R8;
  uint in_R9D;
  size_t bufferSize;
  uint in_stack_00000018;
  size_t lhSize;
  size_t mhSize;
  size_t ohSize;
  size_t hhSize;
  U32 offset;
  size_t maxNbBits;
  U32 wksp [1216];
  BYTE *dstPtr;
  size_t averageSampleSize;
  size_t totalSrcSize;
  size_t eSize;
  size_t errorCode;
  size_t pos;
  U32 total;
  U32 llLog;
  U32 mlLog;
  U32 Offlog;
  U32 huffLog;
  U32 u;
  ZSTD_parameters params;
  EStats_ress_t esr;
  offsetCount_t bestRepOffset [4];
  U32 repOffset [1024];
  short litLengthNCount [36];
  uint litLengthCount [36];
  short matchLengthNCount [53];
  uint matchLengthCount [53];
  U32 offcodeMax;
  short offcodeNCount [31];
  uint offcodeCount [31];
  HUF_CElt hufTable [257];
  uint countLit [256];
  U32 val32;
  size_t in_stack_ffffffffffffcc80;
  ZSTD_CCtx *memPtr;
  unsigned_long_long in_stack_ffffffffffffcc88;
  short *normalizedCounter;
  undefined8 in_stack_ffffffffffffcc90;
  int compressionLevel_00;
  ZSTD_CCtx *in_stack_ffffffffffffcc98;
  ZSTD_freeFunction workSpace;
  ZSTD_CDict *in_stack_ffffffffffffcca8;
  uint *in_stack_ffffffffffffccb0;
  HUF_CElt *in_stack_ffffffffffffccb8;
  size_t in_stack_ffffffffffffccc0;
  void *in_stack_ffffffffffffccc8;
  undefined4 in_stack_ffffffffffffccd0;
  undefined4 in_stack_ffffffffffffcce0;
  uint in_stack_ffffffffffffcce4;
  short *in_stack_ffffffffffffcce8;
  U32 *in_stack_ffffffffffffccf8;
  uint *in_stack_ffffffffffffcd00;
  uint *in_stack_ffffffffffffcd08;
  uint *in_stack_ffffffffffffcd10;
  uint *in_stack_ffffffffffffcd18;
  ZSTD_parameters *in_stack_ffffffffffffcd20;
  EStats_ress_t in_stack_ffffffffffffcd30;
  void *in_stack_ffffffffffffcd48;
  size_t in_stack_ffffffffffffcd50;
  U32 in_stack_ffffffffffffcd58;
  ZSTD_dictContentType_e in_stack_ffffffffffffcd70;
  ZSTD_dictLoadMethod_e in_stack_ffffffffffffcd74;
  size_t in_stack_ffffffffffffcd78;
  void *in_stack_ffffffffffffcd80;
  ZSTD_compressionParameters in_stack_ffffffffffffcd90;
  ZSTD_customMem in_stack_ffffffffffffcdb0;
  uint *local_1fd8;
  long local_1fc8;
  uint local_1fac;
  undefined1 local_1fa8 [8];
  ZSTD_CCtx *local_1fa0;
  short *local_1f98;
  undefined4 local_1f90;
  ZSTD_CDict *local_1f80;
  ZSTD_CCtx *local_1f78;
  short *local_1f70;
  offsetCount_t local_1f68 [4];
  U32 local_1f48 [1044];
  undefined4 local_ef8 [64];
  undefined4 local_df8 [55];
  uint local_d1c;
  uint local_cd8 [548];
  uint local_448 [259];
  uint local_3c;
  size_t *local_38;
  long local_30;
  int local_24;
  ulong local_20;
  
  compressionLevel_00 = (int)((ulong)in_stack_ffffffffffffcc90 >> 0x20);
  local_3c = in_R9D;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_24 = in_EDX;
  local_20 = in_RSI;
  local_d1c = ZSTD_highbit32(0);
  memset(&local_1f80,0,0x18);
  local_1fc8 = 0;
  ZDICT_totalSampleSize(local_38,local_3c);
  if (local_d1c < 0x1f) {
    for (local_1fac = 0; local_1fac < 0x100; local_1fac = local_1fac + 1) {
      local_448[local_1fac] = 1;
    }
    for (local_1fac = 0; local_1fac <= local_d1c; local_1fac = local_1fac + 1) {
      local_cd8[local_1fac] = 1;
    }
    for (local_1fac = 0; local_1fac < 0x35; local_1fac = local_1fac + 1) {
      local_df8[local_1fac] = 1;
    }
    for (local_1fac = 0; local_1fac < 0x24; local_1fac = local_1fac + 1) {
      local_ef8[local_1fac] = 1;
    }
    memset(local_1f48,0,0x1000);
    local_1f48[8] = 1;
    local_1f48[4] = 1;
    local_1f48[1] = 1;
    memset(local_1f68,0,0x20);
    if (local_24 == 0) {
      local_24 = 3;
    }
    ZSTD_getParams(compressionLevel_00,in_stack_ffffffffffffcc88,in_stack_ffffffffffffcc80);
    memcpy(local_1fa8,&stack0xffffffffffffcce0,0x28);
    bufferSize = CONCAT44(compressionLevel_00,local_1f90);
    in_stack_ffffffffffffcc98 = (ZSTD_CCtx *)(ZSTD_allocFunction)0x0;
    workSpace = (ZSTD_freeFunction)0x0;
    in_stack_ffffffffffffcca8 = (ZSTD_CDict *)(void *)0x0;
    local_1f80 = ZSTD_createCDict_advanced
                           (in_stack_ffffffffffffcd80,in_stack_ffffffffffffcd78,
                            in_stack_ffffffffffffcd74,in_stack_ffffffffffffcd70,
                            in_stack_ffffffffffffcd90,in_stack_ffffffffffffcdb0);
    local_1f78 = ZSTD_createCCtx();
    local_1f70 = (short *)malloc(0x20000);
    if (((local_1f80 == (ZSTD_CDict *)0x0) || (local_1f78 == (ZSTD_CCtx *)0x0)) ||
       (local_1f70 == (short *)0x0)) {
      local_1fd8 = (uint *)0xffffffffffffffc0;
      if (in_stack_00000018 != 0) {
        fprintf(_stderr,"Not enough memory \n");
        fflush(_stderr);
      }
    }
    else {
      memPtr = local_1fa0;
      normalizedCounter = local_1f98;
      for (local_1fac = 0; local_1fac < local_3c; local_1fac = local_1fac + 1) {
        bufferSize = local_30 + local_1fc8;
        in_stack_ffffffffffffcc98 = (ZSTD_CCtx *)local_38[local_1fac];
        workSpace = (ZSTD_freeFunction)CONCAT44((int)((ulong)workSpace >> 0x20),in_stack_00000018);
        memPtr = local_1f78;
        normalizedCounter = local_1f70;
        ZDICT_countEStats(in_stack_ffffffffffffcd30,in_stack_ffffffffffffcd20,
                          in_stack_ffffffffffffcd18,in_stack_ffffffffffffcd10,
                          in_stack_ffffffffffffcd08,in_stack_ffffffffffffcd00,
                          in_stack_ffffffffffffccf8,in_stack_ffffffffffffcd48,
                          in_stack_ffffffffffffcd50,in_stack_ffffffffffffcd58);
        local_1fc8 = local_38[local_1fac] + local_1fc8;
      }
      if (3 < in_stack_00000018) {
        if (3 < in_stack_00000018) {
          fprintf(_stderr,"Offset Code Frequencies : \n");
          fflush(_stderr);
        }
        for (local_1fac = 0; local_1fac <= local_d1c; local_1fac = local_1fac + 1) {
          if (3 < in_stack_00000018) {
            fprintf(_stderr,"%2u :%7u \n",(ulong)local_1fac,(ulong)local_cd8[local_1fac]);
            fflush(_stderr);
          }
        }
      }
      local_1fd8 = (uint *)HUF_buildCTable_wksp
                                     (in_stack_ffffffffffffccb8,in_stack_ffffffffffffccb0,
                                      (U32)((ulong)in_stack_ffffffffffffcca8 >> 0x20),
                                      (U32)in_stack_ffffffffffffcca8,workSpace,
                                      (size_t)in_stack_ffffffffffffcc98);
      uVar1 = ERR_isError((size_t)local_1fd8);
      if (uVar1 == 0) {
        if (local_1fd8 == (uint *)0x8) {
          if (1 < in_stack_00000018) {
            fprintf(_stderr,
                    "warning : pathological dataset : literals are not compressible : samples are noisy or too regular \n"
                   );
            fflush(_stderr);
          }
          ZDICT_flatLit(local_448);
          sVar3 = HUF_buildCTable_wksp
                            (in_stack_ffffffffffffccb8,in_stack_ffffffffffffccb0,
                             (U32)((ulong)in_stack_ffffffffffffcca8 >> 0x20),
                             (U32)in_stack_ffffffffffffcca8,workSpace,
                             (size_t)in_stack_ffffffffffffcc98);
          if (sVar3 != 9) {
            __assert_fail("maxNbBits==9",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xc210,
                          "size_t ZDICT_analyzeEntropy(void *, size_t, int, const void *, const size_t *, unsigned int, const void *, size_t, unsigned int)"
                         );
          }
          local_1fd8 = (uint *)0x9;
        }
        for (uVar1 = 1; uVar1 < 0x400; uVar1 = uVar1 + 1) {
          ZDICT_insertSortCount(local_1f68,uVar1,local_1f48[uVar1]);
        }
        for (local_1fac = 0; local_1fac <= local_d1c; local_1fac = local_1fac + 1) {
        }
        puVar4 = (uint *)FSE_normalizeCount(in_stack_ffffffffffffcce8,in_stack_ffffffffffffcce4,
                                            local_1fd8,CONCAT44(uVar1,in_stack_ffffffffffffccd0),
                                            (uint)((ulong)in_stack_ffffffffffffccc8 >> 0x20),
                                            (uint)in_stack_ffffffffffffccc8);
        uVar2 = ERR_isError((size_t)puVar4);
        if (uVar2 == 0) {
          for (local_1fac = 0; local_1fac < 0x35; local_1fac = local_1fac + 1) {
          }
          puVar4 = (uint *)FSE_normalizeCount(in_stack_ffffffffffffcce8,in_stack_ffffffffffffcce4,
                                              local_1fd8,CONCAT44(uVar1,in_stack_ffffffffffffccd0),
                                              (uint)((ulong)in_stack_ffffffffffffccc8 >> 0x20),
                                              (uint)in_stack_ffffffffffffccc8);
          uVar2 = ERR_isError((size_t)puVar4);
          if (uVar2 == 0) {
            for (local_1fac = 0; local_1fac < 0x24; local_1fac = local_1fac + 1) {
            }
            local_1fd8 = (uint *)FSE_normalizeCount(in_stack_ffffffffffffcce8,
                                                    in_stack_ffffffffffffcce4,local_1fd8,
                                                    CONCAT44(uVar1,in_stack_ffffffffffffccd0),
                                                    (uint)((ulong)in_stack_ffffffffffffccc8 >> 0x20)
                                                    ,(uint)in_stack_ffffffffffffccc8);
            uVar1 = ERR_isError((size_t)local_1fd8);
            if (uVar1 == 0) {
              val32 = 0;
              puVar4 = (uint *)HUF_writeCTable_wksp
                                         (in_stack_ffffffffffffccc8,in_stack_ffffffffffffccc0,
                                          in_stack_ffffffffffffccb8,
                                          (uint)((ulong)in_stack_ffffffffffffccb0 >> 0x20),
                                          (uint)in_stack_ffffffffffffccb0,in_stack_ffffffffffffcca8,
                                          CONCAT44(in_stack_ffffffffffffcce4,
                                                   in_stack_ffffffffffffcce0));
              uVar1 = ERR_isError((size_t)puVar4);
              if (uVar1 == 0) {
                local_20 = local_20 - (long)puVar4;
                code = (uint *)FSE_writeNCount(in_stack_ffffffffffffcc98,bufferSize,
                                               normalizedCounter,(uint)((ulong)memPtr >> 0x20),
                                               (uint)memPtr);
                uVar1 = ERR_isError((size_t)code);
                if (uVar1 == 0) {
                  local_20 = local_20 - (long)code;
                  code_00 = (uint *)FSE_writeNCount(in_stack_ffffffffffffcc98,bufferSize,
                                                    normalizedCounter,(uint)((ulong)memPtr >> 0x20),
                                                    (uint)memPtr);
                  uVar1 = ERR_isError((size_t)code_00);
                  if (uVar1 == 0) {
                    local_20 = local_20 - (long)code_00;
                    local_1fd8 = (uint *)FSE_writeNCount(in_stack_ffffffffffffcc98,bufferSize,
                                                         normalizedCounter,
                                                         (uint)((ulong)memPtr >> 0x20),(uint)memPtr)
                    ;
                    uVar1 = ERR_isError((size_t)local_1fd8);
                    if (uVar1 == 0) {
                      local_20 = local_20 - (long)local_1fd8;
                      if (local_20 < 0xc) {
                        local_1fd8 = (uint *)0xffffffffffffffba;
                        if (in_stack_00000018 != 0) {
                          fprintf(_stderr,"not enough space to write RepOffsets \n");
                          fflush(_stderr);
                        }
                      }
                      else {
                        MEM_writeLE32(memPtr,val32);
                        MEM_writeLE32(memPtr,val32);
                        MEM_writeLE32(memPtr,val32);
                        local_1fd8 = (uint *)((long)local_1fd8 +
                                             (long)code_00 + (long)code + (long)puVar4 + 0xc);
                      }
                    }
                    else if (in_stack_00000018 != 0) {
                      fprintf(_stderr,"FSE_writeNCount error with litlengthNCount \n");
                      fflush(_stderr);
                    }
                  }
                  else {
                    local_1fd8 = code_00;
                    if (in_stack_00000018 != 0) {
                      fprintf(_stderr,"FSE_writeNCount error with matchLengthNCount \n");
                      fflush(_stderr);
                    }
                  }
                }
                else {
                  local_1fd8 = code;
                  if (in_stack_00000018 != 0) {
                    fprintf(_stderr,"FSE_writeNCount error with offcodeNCount \n");
                    fflush(_stderr);
                  }
                }
              }
              else {
                local_1fd8 = puVar4;
                if (in_stack_00000018 != 0) {
                  fprintf(_stderr,"HUF_writeCTable error \n");
                  fflush(_stderr);
                }
              }
            }
            else if (in_stack_00000018 != 0) {
              fprintf(_stderr,"FSE_normalizeCount error with litLengthCount \n");
              fflush(_stderr);
            }
          }
          else {
            local_1fd8 = puVar4;
            if (in_stack_00000018 != 0) {
              fprintf(_stderr,"FSE_normalizeCount error with matchLengthCount \n");
              fflush(_stderr);
            }
          }
        }
        else {
          local_1fd8 = puVar4;
          if (in_stack_00000018 != 0) {
            fprintf(_stderr,"FSE_normalizeCount error with offcodeCount \n");
            fflush(_stderr);
          }
        }
      }
      else if (in_stack_00000018 != 0) {
        fprintf(_stderr," HUF_buildCTable error \n");
        fflush(_stderr);
      }
    }
  }
  else {
    local_1fd8 = (uint *)0xffffffffffffffde;
  }
  ZSTD_freeCDict(in_stack_ffffffffffffcca8);
  ZSTD_freeCCtx(in_stack_ffffffffffffcc98);
  free(local_1f70);
  return (size_t)local_1fd8;
}

Assistant:

static size_t ZDICT_analyzeEntropy(void*  dstBuffer, size_t maxDstSize,
                                   int compressionLevel,
                             const void*  srcBuffer, const size_t* fileSizes, unsigned nbFiles,
                             const void* dictBuffer, size_t  dictBufferSize,
                                   unsigned notificationLevel)
{
    unsigned countLit[256];
    HUF_CREATE_STATIC_CTABLE(hufTable, 255);
    unsigned offcodeCount[OFFCODE_MAX+1];
    short offcodeNCount[OFFCODE_MAX+1];
    U32 offcodeMax = ZSTD_highbit32((U32)(dictBufferSize + 128 KB));
    unsigned matchLengthCount[MaxML+1];
    short matchLengthNCount[MaxML+1];
    unsigned litLengthCount[MaxLL+1];
    short litLengthNCount[MaxLL+1];
    U32 repOffset[MAXREPOFFSET];
    offsetCount_t bestRepOffset[ZSTD_REP_NUM+1];
    EStats_ress_t esr = { NULL, NULL, NULL };
    ZSTD_parameters params;
    U32 u, huffLog = 11, Offlog = OffFSELog, mlLog = MLFSELog, llLog = LLFSELog, total;
    size_t pos = 0, errorCode;
    size_t eSize = 0;
    size_t const totalSrcSize = ZDICT_totalSampleSize(fileSizes, nbFiles);
    size_t const averageSampleSize = totalSrcSize / (nbFiles + !nbFiles);
    BYTE* dstPtr = (BYTE*)dstBuffer;
    U32 wksp[HUF_CTABLE_WORKSPACE_SIZE_U32];

    /* init */
    DEBUGLOG(4, "ZDICT_analyzeEntropy");
    if (offcodeMax>OFFCODE_MAX) { eSize = ERROR(dictionaryCreation_failed); goto _cleanup; }   /* too large dictionary */
    for (u=0; u<256; u++) countLit[u] = 1;   /* any character must be described */
    for (u=0; u<=offcodeMax; u++) offcodeCount[u] = 1;
    for (u=0; u<=MaxML; u++) matchLengthCount[u] = 1;
    for (u=0; u<=MaxLL; u++) litLengthCount[u] = 1;
    memset(repOffset, 0, sizeof(repOffset));
    repOffset[1] = repOffset[4] = repOffset[8] = 1;
    memset(bestRepOffset, 0, sizeof(bestRepOffset));
    if (compressionLevel==0) compressionLevel = ZSTD_CLEVEL_DEFAULT;
    params = ZSTD_getParams(compressionLevel, averageSampleSize, dictBufferSize);

    esr.dict = ZSTD_createCDict_advanced(dictBuffer, dictBufferSize, ZSTD_dlm_byRef, ZSTD_dct_rawContent, params.cParams, ZSTD_defaultCMem);
    esr.zc = ZSTD_createCCtx();
    esr.workPlace = malloc(ZSTD_BLOCKSIZE_MAX);
    if (!esr.dict || !esr.zc || !esr.workPlace) {
        eSize = ERROR(memory_allocation);
        DISPLAYLEVEL(1, "Not enough memory \n");
        goto _cleanup;
    }

    /* collect stats on all samples */
    for (u=0; u<nbFiles; u++) {
        ZDICT_countEStats(esr, &params,
                          countLit, offcodeCount, matchLengthCount, litLengthCount, repOffset,
                         (const char*)srcBuffer + pos, fileSizes[u],
                          notificationLevel);
        pos += fileSizes[u];
    }

    if (notificationLevel >= 4) {
        /* writeStats */
        DISPLAYLEVEL(4, "Offset Code Frequencies : \n");
        for (u=0; u<=offcodeMax; u++) {
            DISPLAYLEVEL(4, "%2u :%7u \n", u, offcodeCount[u]);
    }   }

    /* analyze, build stats, starting with literals */
    {   size_t maxNbBits = HUF_buildCTable_wksp(hufTable, countLit, 255, huffLog, wksp, sizeof(wksp));
        if (HUF_isError(maxNbBits)) {
            eSize = maxNbBits;
            DISPLAYLEVEL(1, " HUF_buildCTable error \n");
            goto _cleanup;
        }
        if (maxNbBits==8) {  /* not compressible : will fail on HUF_writeCTable() */
            DISPLAYLEVEL(2, "warning : pathological dataset : literals are not compressible : samples are noisy or too regular \n");
            ZDICT_flatLit(countLit);  /* replace distribution by a fake "mostly flat but still compressible" distribution, that HUF_writeCTable() can encode */
            maxNbBits = HUF_buildCTable_wksp(hufTable, countLit, 255, huffLog, wksp, sizeof(wksp));
            assert(maxNbBits==9);
        }
        huffLog = (U32)maxNbBits;
    }

    /* looking for most common first offsets */
    {   U32 offset;
        for (offset=1; offset<MAXREPOFFSET; offset++)
            ZDICT_insertSortCount(bestRepOffset, offset, repOffset[offset]);
    }
    /* note : the result of this phase should be used to better appreciate the impact on statistics */

    total=0; for (u=0; u<=offcodeMax; u++) total+=offcodeCount[u];
    errorCode = FSE_normalizeCount(offcodeNCount, Offlog, offcodeCount, total, offcodeMax, /* useLowProbCount */ 1);
    if (FSE_isError(errorCode)) {
        eSize = errorCode;
        DISPLAYLEVEL(1, "FSE_normalizeCount error with offcodeCount \n");
        goto _cleanup;
    }
    Offlog = (U32)errorCode;

    total=0; for (u=0; u<=MaxML; u++) total+=matchLengthCount[u];
    errorCode = FSE_normalizeCount(matchLengthNCount, mlLog, matchLengthCount, total, MaxML, /* useLowProbCount */ 1);
    if (FSE_isError(errorCode)) {
        eSize = errorCode;
        DISPLAYLEVEL(1, "FSE_normalizeCount error with matchLengthCount \n");
        goto _cleanup;
    }
    mlLog = (U32)errorCode;

    total=0; for (u=0; u<=MaxLL; u++) total+=litLengthCount[u];
    errorCode = FSE_normalizeCount(litLengthNCount, llLog, litLengthCount, total, MaxLL, /* useLowProbCount */ 1);
    if (FSE_isError(errorCode)) {
        eSize = errorCode;
        DISPLAYLEVEL(1, "FSE_normalizeCount error with litLengthCount \n");
        goto _cleanup;
    }
    llLog = (U32)errorCode;

    /* write result to buffer */
    {   size_t const hhSize = HUF_writeCTable_wksp(dstPtr, maxDstSize, hufTable, 255, huffLog, wksp, sizeof(wksp));
        if (HUF_isError(hhSize)) {
            eSize = hhSize;
            DISPLAYLEVEL(1, "HUF_writeCTable error \n");
            goto _cleanup;
        }
        dstPtr += hhSize;
        maxDstSize -= hhSize;
        eSize += hhSize;
    }

    {   size_t const ohSize = FSE_writeNCount(dstPtr, maxDstSize, offcodeNCount, OFFCODE_MAX, Offlog);
        if (FSE_isError(ohSize)) {
            eSize = ohSize;
            DISPLAYLEVEL(1, "FSE_writeNCount error with offcodeNCount \n");
            goto _cleanup;
        }
        dstPtr += ohSize;
        maxDstSize -= ohSize;
        eSize += ohSize;
    }

    {   size_t const mhSize = FSE_writeNCount(dstPtr, maxDstSize, matchLengthNCount, MaxML, mlLog);
        if (FSE_isError(mhSize)) {
            eSize = mhSize;
            DISPLAYLEVEL(1, "FSE_writeNCount error with matchLengthNCount \n");
            goto _cleanup;
        }
        dstPtr += mhSize;
        maxDstSize -= mhSize;
        eSize += mhSize;
    }

    {   size_t const lhSize = FSE_writeNCount(dstPtr, maxDstSize, litLengthNCount, MaxLL, llLog);
        if (FSE_isError(lhSize)) {
            eSize = lhSize;
            DISPLAYLEVEL(1, "FSE_writeNCount error with litlengthNCount \n");
            goto _cleanup;
        }
        dstPtr += lhSize;
        maxDstSize -= lhSize;
        eSize += lhSize;
    }

    if (maxDstSize<12) {
        eSize = ERROR(dstSize_tooSmall);
        DISPLAYLEVEL(1, "not enough space to write RepOffsets \n");
        goto _cleanup;
    }
# if 0
    MEM_writeLE32(dstPtr+0, bestRepOffset[0].offset);
    MEM_writeLE32(dstPtr+4, bestRepOffset[1].offset);
    MEM_writeLE32(dstPtr+8, bestRepOffset[2].offset);
#else
    /* at this stage, we don't use the result of "most common first offset",
     * as the impact of statistics is not properly evaluated */
    MEM_writeLE32(dstPtr+0, repStartValue[0]);
    MEM_writeLE32(dstPtr+4, repStartValue[1]);
    MEM_writeLE32(dstPtr+8, repStartValue[2]);
#endif
    eSize += 12;

_cleanup:
    ZSTD_freeCDict(esr.dict);
    ZSTD_freeCCtx(esr.zc);
    free(esr.workPlace);

    return eSize;
}